

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O2

bool loadSphereProgram(void)

{
  bool bVar1;
  GLenum GVar2;
  djg_program *program;
  char buf [1024];
  
  program = djgp_create();
  fwrite("Loading {Sphere-Program}\n",0x19,1,_stdout);
  fflush(_stdout);
  if ((ulong)(uint)g_sphere.shading.mode < 4) {
    djgp_push_string(program,(&PTR_anon_var_dwarf_16055_001ffa68)[(uint)g_sphere.shading.mode]);
  }
  if (g_sphere.brdf.id == 1) {
    djgp_push_string(program,"#define BRDF_MERL 1\n");
  }
  djgp_push_string(program,"#define BUFFER_BINDING_RANDOM %i\n",2);
  djgp_push_string(program,"#define BUFFER_BINDING_TRANSFORMS %i\n",1);
  djgp_push_string(program,"#define BUFFER_BINDING_SPHERES %i\n",0);
  strcat2(buf,g_app.dir.shader,"ggx.glsl");
  djgp_push_file(program,buf);
  strcat2(buf,g_app.dir.shader,"brdf_merl.glsl");
  djgp_push_file(program,buf);
  strcat2(buf,g_app.dir.shader,"sphere.glsl");
  djgp_push_file(program,buf);
  bVar1 = djgp_to_gl(program,0x1c2,false,true,g_gl.programs + 2);
  if (bVar1) {
    djgp_release(program);
    g_gl.uniforms[6] = (*glad_glGetUniformLocation)(g_gl.programs[2],"u_SamplesPerPass");
    g_gl.uniforms[7] = (*glad_glGetUniformLocation)(g_gl.programs[2],"u_MerlSampler");
    g_gl.uniforms[8] = (*glad_glGetUniformLocation)(g_gl.programs[2],"u_Alpha");
    g_gl.uniforms[9] = (*glad_glGetUniformLocation)(g_gl.programs[2],"u_Color");
    g_gl.uniforms[0xb] = (*glad_glGetUniformLocation)(g_gl.programs[2],"u_Dir");
    g_gl.uniforms[10] = (*glad_glGetUniformLocation)(g_gl.programs[2],"u_CmapSampler");
    g_gl.uniforms[4] = (*glad_glGetUniformLocation)(g_gl.programs[2],"u_Exposure");
    g_gl.uniforms[5] = (*glad_glGetUniformLocation)(g_gl.programs[2],"u_Gamma");
    configureSphereProgram();
    GVar2 = (*glad_glGetError)();
    bVar1 = GVar2 == 0;
  }
  else {
    fwrite("=> Failure <=\n",0xe,1,_stdout);
    fflush(_stdout);
    djgp_release(program);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool loadSphereProgram()
{
    djg_program *djp = djgp_create();
    GLuint *program = &g_gl.programs[PROGRAM_SPHERE];
    char buf[1024];

    LOG("Loading {Sphere-Program}\n");
    switch (g_sphere.shading.mode) {
        case SHADING_DEBUG:
            djgp_push_string(djp, "#define SHADE_DEBUG 1\n");
            break;
        case SHADING_COLOR:
            djgp_push_string(djp, "#define SHADE_COLOR 1\n");
            break;
        case SHADING_BRDF:
            djgp_push_string(djp, "#define SHADE_BRDF 1\n");
            break;
        case SHADING_COLORMAP:
            djgp_push_string(djp, "#define SHADE_CMAP 1\n");
            break;
    };
    if (g_sphere.brdf.id == BRDF_MERL)
        djgp_push_string(djp, "#define BRDF_MERL 1\n");
    djgp_push_string(djp, "#define BUFFER_BINDING_RANDOM %i\n", STREAM_RANDOM);
    djgp_push_string(djp, "#define BUFFER_BINDING_TRANSFORMS %i\n", STREAM_TRANSFORM);
    djgp_push_string(djp, "#define BUFFER_BINDING_SPHERES %i\n", STREAM_SPHERES);
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "ggx.glsl"));
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "brdf_merl.glsl"));
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "sphere.glsl"));

    if (!djgp_to_gl(djp, 450, false, true, program)) {
        LOG("=> Failure <=\n");
        djgp_release(djp);

        return false;
    }
    djgp_release(djp);

    g_gl.uniforms[UNIFORM_SPHERE_SAMPLES_PER_PASS] =
        glGetUniformLocation(g_gl.programs[PROGRAM_SPHERE], "u_SamplesPerPass");
    g_gl.uniforms[UNIFORM_SPHERE_MERL_SAMPLER] =
        glGetUniformLocation(g_gl.programs[PROGRAM_SPHERE], "u_MerlSampler");
    g_gl.uniforms[UNIFORM_SPHERE_ALPHA] =
        glGetUniformLocation(g_gl.programs[PROGRAM_SPHERE], "u_Alpha");
    g_gl.uniforms[UNIFORM_SPHERE_COLOR] =
        glGetUniformLocation(g_gl.programs[PROGRAM_SPHERE], "u_Color");
    g_gl.uniforms[UNIFORM_SPHERE_DIR] =
        glGetUniformLocation(g_gl.programs[PROGRAM_SPHERE], "u_Dir");
    g_gl.uniforms[UNIFORM_SPHERE_CMAP_SAMPLER] =
        glGetUniformLocation(g_gl.programs[PROGRAM_SPHERE], "u_CmapSampler");
    g_gl.uniforms[UNIFORM_SPHERE_EXPOSURE] =
        glGetUniformLocation(g_gl.programs[PROGRAM_SPHERE], "u_Exposure");
    g_gl.uniforms[UNIFORM_SPHERE_GAMMA] =
        glGetUniformLocation(g_gl.programs[PROGRAM_SPHERE], "u_Gamma");

    configureSphereProgram();

    return (glGetError() == GL_NO_ERROR);
}